

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

hwaddr m68k_cpu_get_phys_page_debug_m68k(CPUState *cs,vaddr addr)

{
  int iVar1;
  target_ulong_conflict page_size;
  int prot;
  hwaddr phys_addr;
  target_ulong_conflict local_20;
  int local_1c;
  ulong local_18;
  
  if (-1 < *(short *)(cs[1].tb_jmp_cache + 0xb8)) {
    return addr;
  }
  iVar1 = get_physical_address
                    ((CPUM68KState_conflict *)(cs[1].tb_jmp_cache + 0x8f),&local_18,&local_1c,
                     (target_ulong_conflict)addr,
                     ((*(uint *)((long)cs[1].tb_jmp_cache + 0x4bc) >> 0xd & 1) != 0) + 0x24,
                     &local_20);
  return -(ulong)(iVar1 != 0) | local_18;
}

Assistant:

hwaddr m68k_cpu_get_phys_page_debug(CPUState *cs, vaddr addr)
{
    M68kCPU *cpu = M68K_CPU(cs);
    CPUM68KState *env = &cpu->env;
    hwaddr phys_addr;
    int prot;
    int access_type;
    target_ulong page_size;

    if ((env->mmu.tcr & M68K_TCR_ENABLED) == 0) {
        /* MMU disabled */
        return addr;
    }

    access_type = ACCESS_DATA | ACCESS_DEBUG;
    if (env->sr & SR_S) {
        access_type |= ACCESS_SUPER;
    }
    if (get_physical_address(env, &phys_addr, &prot,
                             addr, access_type, &page_size) != 0) {
        return -1;
    }
    return phys_addr;
}